

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  uint uVar1;
  int num_channels;
  int x_stride;
  int iVar2;
  int height;
  int line_order;
  int iVar3;
  EXRChannelInfo *pEVar4;
  pointer puVar5;
  long lVar6;
  EXRAttribute *attributes;
  int *piVar7;
  int width;
  EXRImage *pEVar8;
  size_t sVar9;
  undefined4 uVar10;
  ostream *poVar11;
  long *plVar12;
  EXRTile *pEVar13;
  uchar **ppuVar14;
  unsigned_long uVar15;
  int iVar16;
  string *psVar17;
  int num_lines;
  int *piVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  uchar *puVar22;
  ulong uVar23;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar24;
  int iVar25;
  size_t y_idx;
  uint uVar26;
  ulong uVar27;
  size_t __nmemb;
  int iVar28;
  bool bVar29;
  bool bVar30;
  EXRChannelInfo *in_stack_fffffffffffffd68;
  pointer puVar31;
  undefined4 uVar32;
  long *local_280;
  long local_270 [2];
  EXRImage *local_260;
  string *local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  uchar *local_238;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_230;
  int local_224;
  size_t local_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar25 = exr_header->compression_type;
  pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10;
  if ((iVar25 != 3) && (iVar25 != 0x80)) {
    if (iVar25 == 4) {
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20;
    }
    else {
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    }
  }
  iVar25 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar28 = exr_header->data_window[3] - exr_header->data_window[1];
  uVar1 = iVar25 + 1;
  local_240 = (ulong)uVar1;
  uVar26 = iVar28 + 1;
  local_248 = (ulong)uVar26;
  if (iVar28 < -1 || iVar25 < -1) {
    iVar25 = -4;
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Invalid data width or data height: ",0x23);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,uVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
    plVar12 = (long *)std::ostream::operator<<(poVar11,uVar26);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_280);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
LAB_0013f22a:
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return iVar25;
  }
  if (0x7fffff < iVar25 || 0x7fffff < iVar28) {
    iVar25 = -4;
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,uVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"data_height = ",0xe);
    plVar12 = (long *)std::ostream::operator<<(poVar11,uVar26);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_280);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
    goto LAB_0013f22a;
  }
  num_channels = exr_header->num_channels;
  uVar27 = (ulong)num_channels;
  local_250 = (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar4 = exr_header->channels;
  local_260 = exr_image;
  local_258 = err;
  local_238 = head;
  local_230 = offsets;
  local_220 = size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar27);
  psVar17 = local_258;
  if (num_channels == 0) {
    iVar16 = 0;
  }
  else {
    piVar18 = &pEVar4->pixel_type;
    uVar15 = 0;
    iVar16 = 0;
    bVar29 = false;
    uVar21 = 1;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21 - 1] = uVar15;
      uVar23 = (ulong)(uint)*piVar18;
      if (2 < uVar23) break;
      iVar16 = iVar16 + *(int *)(&DAT_0018c450 + uVar23 * 4);
      uVar15 = uVar15 + *(long *)(&DAT_0018c460 + uVar23 * 8);
      bVar29 = uVar27 <= uVar21;
      piVar18 = piVar18 + 0x44;
      bVar30 = uVar21 != uVar27;
      uVar21 = uVar21 + 1;
    } while (bVar30);
    if (!bVar29) {
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffffc;
      if (local_258 != (string *)0x0) {
        std::__cxx11::string::append((char *)local_258);
      }
      goto LAB_0013f973;
    }
  }
  if (exr_header->tiled == 0) {
    if (0xffffffc000000000 <
        (local_240 & 0xffffffff) * uVar27 * (local_248 & 0xffffffff) - 0x4000000000) {
      uVar27 = local_250 >> 3;
      ppuVar14 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                               (int)local_240,(int)local_248);
      sVar9 = local_220;
      local_260->images = ppuVar14;
      uVar26 = (uint)uVar27;
      if (0 < (int)uVar26) {
        local_250 = (ulong)iVar16;
        uVar27 = 0;
        puVar22 = local_238;
        bVar29 = false;
        do {
          uVar15 = (local_230->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar27];
          bVar30 = true;
          if (uVar15 + 8 <= sVar9) {
            iVar25 = *(int *)(puVar22 + uVar15 + 4);
            if ((ulong)(long)iVar25 <= sVar9 - (uVar15 + 8)) {
              iVar28 = *(int *)(puVar22 + uVar15);
              if (iVar25 != 0 && 0xffbffffe < iVar28 - 0x200001U) {
                iVar20 = (int)pvVar24 + iVar28;
                iVar16 = exr_header->data_window[3] + 1;
                if (iVar20 <= iVar16) {
                  iVar16 = iVar20;
                }
                if (((iVar16 - iVar28 != 0 && iVar28 <= iVar16) &&
                    (0xffffffff00000000 <
                     ((long)iVar28 - (long)exr_header->data_window[1]) - 0x80000000U)) &&
                   (iVar20 = iVar28 - exr_header->data_window[1], -1 < iVar20)) {
                  bVar30 = DecodePixelData(local_260->images,exr_header->requested_pixel_types,
                                           puVar22 + uVar15 + 8,(long)iVar25,
                                           exr_header->compression_type,exr_header->line_order,
                                           (int)local_240,(int)local_248,(int)local_240,(int)uVar27,
                                           iVar20,iVar16 - iVar28,local_250,
                                           (long)exr_header->num_channels,
                                           (EXRAttribute *)exr_header->channels,
                                           (size_t)&channel_offset_list,in_stack_fffffffffffffd68,
                                           pvVar24);
                  bVar30 = (bool)(!bVar30 | bVar29);
                  puVar22 = local_238;
                }
              }
            }
          }
          psVar17 = local_258;
          uVar27 = uVar27 + 1;
          bVar29 = bVar30;
        } while ((uVar26 & 0x7fffffff) != uVar27);
        if (bVar30) {
          pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffffc;
          if (local_258 == (string *)0x0) goto LAB_0013f973;
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::__cxx11::string::append((char *)psVar17);
          goto LAB_0013f952;
        }
      }
LAB_0013f869:
      if (0 < exr_header->num_channels) {
        piVar18 = exr_header->pixel_types;
        piVar7 = exr_header->requested_pixel_types;
        lVar19 = 0;
        do {
          piVar18[lVar19] = piVar7[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 < exr_header->num_channels);
      }
      local_260->num_channels = num_channels;
      local_260->width = (int)local_240;
      local_260->height = (int)local_248;
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      goto LAB_0013f973;
    }
    pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffffc;
    if (local_258 == (string *)0x0) goto LAB_0013f973;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Image data size is zero or too large: width = ",0x2e);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_240);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", height = ",0xb);
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_248);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", channels = ",0xd);
    plVar12 = (long *)std::ostream::operator<<(poVar11,num_channels);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)psVar17,(ulong)local_280);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
  }
  else if (exr_header->tile_size_x < 0) {
    pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffff7;
    if (local_258 == (string *)0x0) goto LAB_0013f973;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)psVar17,(ulong)local_280);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
  }
  else {
    if (-1 < exr_header->tile_size_y) {
      puVar31 = (local_230->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (local_230->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __nmemb = (long)puVar31 - (long)puVar5 >> 3;
      pEVar13 = (EXRTile *)calloc(__nmemb,0x20);
      local_260->tiles = pEVar13;
      if (puVar31 != puVar5) {
        lVar19 = __nmemb + (__nmemb == 0);
        uVar27 = 0;
        pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((ulong)puVar31 & 0xffffffff00000000);
        psVar17 = local_258;
        do {
          pEVar8 = local_260;
          local_250 = uVar27;
          ppuVar14 = AllocateImage(num_channels,exr_header->channels,
                                   exr_header->requested_pixel_types,exr_header->tile_size_x,
                                   exr_header->tile_size_y);
          pEVar13 = pEVar8->tiles;
          *(uchar ***)((long)&pEVar13->images + local_250 * 4) = ppuVar14;
          lVar6 = *(long *)((long)(local_230->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + local_250);
          if (local_220 < lVar6 + 0x14U) {
            pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffffc;
            if (psVar17 != (string *)0x0) {
              std::__cxx11::string::append((char *)psVar17);
            }
            goto LAB_0013f973;
          }
          if (*(int *)(local_238 + lVar6 + 0xc) != 0 || *(int *)(local_238 + lVar6 + 8) != 0) {
            pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffff6;
            goto LAB_0013f973;
          }
          uVar27 = (ulong)*(int *)(local_238 + lVar6 + 0x10);
          if (((long)uVar27 < 4) || (local_220 - (lVar6 + 0x14U) < uVar27)) {
            pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffffc;
            if (psVar17 != (string *)0x0) {
              std::__cxx11::string::append((char *)psVar17);
            }
            goto LAB_0013f973;
          }
          iVar20 = *(int *)(local_238 + lVar6);
          x_stride = exr_header->tile_size_x;
          if (iVar25 < x_stride * iVar20) {
            __assert_fail("tile_offset_x * tile_size_x < data_width",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x2852,
                          "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                         );
          }
          iVar2 = *(int *)(local_238 + lVar6 + 4);
          height = exr_header->tile_size_y;
          if (iVar28 < height * iVar2) {
            __assert_fail("tile_offset_y * tile_size_y < data_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x2853,
                          "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                         );
          }
          piVar18 = exr_header->requested_pixel_types;
          local_224 = exr_header->compression_type;
          line_order = exr_header->line_order;
          iVar3 = exr_header->num_channels;
          width = (int)local_240 - x_stride * iVar20;
          if ((iVar20 + 1) * x_stride <= iVar25) {
            width = x_stride;
          }
          attributes = (EXRAttribute *)exr_header->channels;
          (&pEVar13->width)[local_250] = width;
          num_lines = (int)local_248 - height * iVar2;
          if ((iVar2 + 1) * height <= iVar28) {
            num_lines = height;
          }
          (&pEVar13->height)[local_250] = num_lines;
          bVar29 = DecodePixelData(ppuVar14,piVar18,local_238 + lVar6 + 0x14,uVar27,local_224,
                                   line_order,width,height,x_stride,0,0,num_lines,(long)iVar16,
                                   (long)iVar3,attributes,(size_t)&channel_offset_list,
                                   in_stack_fffffffffffffd68,pvVar24);
          psVar17 = local_258;
          uVar10 = SUB84(pvVar24,0);
          if (!bVar29) {
            uVar10 = 0xfffffffc;
          }
          uVar32 = (undefined4)((ulong)pvVar24 >> 0x20);
          pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(uVar32,uVar10)
          ;
          if (local_258 != (string *)0x0 && !bVar29) {
            pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(uVar32,0xfffffffc);
            std::__cxx11::string::append((char *)local_258);
          }
          pEVar13 = local_260->tiles;
          (&pEVar13->offset_x)[local_250] = iVar20;
          (&pEVar13->offset_y)[local_250] = iVar2;
          *(undefined8 *)(&pEVar13->level_x + local_250) = 0;
          uVar27 = local_250 + 8;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        if ((int)pvVar24 != 0) goto LAB_0013f973;
      }
      local_260->num_tiles = (int)__nmemb;
      goto LAB_0013f869;
    }
    pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xfffffff7;
    if (local_258 == (string *)0x0) goto LAB_0013f973;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)psVar17,(ulong)local_280);
    if (local_280 != local_270) {
      operator_delete(local_280,local_270[0] + 1);
    }
  }
LAB_0013f952:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_0013f973:
  iVar25 = (int)pvVar24;
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar25;
  }
  operator_delete(channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)channel_offset_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)channel_offset_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return iVar25;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  if ((data_width < 0) || (data_height < 0)) {
    if (err) {
      std::stringstream ss;
      ss << "Invalid data width or data height: " << data_width << ", "
         << data_height << std::endl;
      (*err) += ss.str();
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window[3] + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window[1]);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window[1];
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}